

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

int xmlSchemaGetValidErrors
              (xmlSchemaValidCtxtPtr ctxt,xmlSchemaValidityErrorFunc *err,
              xmlSchemaValidityWarningFunc *warn,void **ctx)

{
  if (ctxt != (xmlSchemaValidCtxtPtr)0x0) {
    if (err != (xmlSchemaValidityErrorFunc *)0x0) {
      *err = ctxt->error;
    }
    if (warn != (xmlSchemaValidityWarningFunc *)0x0) {
      *warn = ctxt->warning;
    }
    if (ctx != (void **)0x0) {
      *ctx = ctxt->errCtxt;
    }
    return 0;
  }
  return -1;
}

Assistant:

int
xmlSchemaGetValidErrors(xmlSchemaValidCtxtPtr ctxt,
			xmlSchemaValidityErrorFunc * err,
			xmlSchemaValidityWarningFunc * warn, void **ctx)
{
	if (ctxt == NULL)
		return (-1);
	if (err != NULL)
		*err = ctxt->error;
	if (warn != NULL)
		*warn = ctxt->warning;
	if (ctx != NULL)
		*ctx = ctxt->errCtxt;
	return (0);
}